

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::CollationElementIterator::setOffset
          (CollationElementIterator *this,int32_t newOffset,UErrorCode *status)

{
  short sVar1;
  RuleBasedCollator *this_00;
  UBool UVar2;
  char16_t cVar3;
  int iVar4;
  UChar32 c;
  uint uVar5;
  int32_t lastSafeOffset;
  ulong uVar6;
  ulong uVar7;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  uVar7 = (ulong)(uint)newOffset;
  if (0 < newOffset) {
    sVar1 = (this->string_).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->string_).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    if (newOffset < iVar4) {
      uVar6 = uVar7;
      do {
        iVar4 = (int)uVar6;
        cVar3 = UnicodeString::doCharAt(&this->string_,iVar4);
        UVar2 = RuleBasedCollator::isUnsafe(this->rbc_,(uint)(ushort)cVar3);
        if (UVar2 == '\0') goto LAB_0022b86f;
        if ((cVar3 & 0xfc00U) == 0xd800) {
          this_00 = this->rbc_;
          c = UnicodeString::char32At(&this->string_,iVar4);
          UVar2 = RuleBasedCollator::isUnsafe(this_00,c);
          if (UVar2 == '\0') goto LAB_0022b86f;
        }
        uVar6 = (ulong)(iVar4 - 1U);
      } while (iVar4 - 1U != 0);
      uVar6 = 0;
LAB_0022b86f:
      uVar5 = (uint)uVar6;
      while ((int)uVar5 < newOffset) {
        (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,uVar6);
        do {
          CollationIterator::nextCE(this->iter_,status);
          if (U_ZERO_ERROR < *status) {
            return;
          }
          uVar5 = (*(this->iter_->super_UObject)._vptr_UObject[5])();
        } while (uVar5 == (uint)uVar6);
        uVar7 = uVar6;
        if ((int)uVar5 <= newOffset) {
          uVar6 = (ulong)uVar5;
          uVar7 = uVar6;
        }
      }
    }
  }
  (*(this->iter_->super_UObject)._vptr_UObject[4])(this->iter_,uVar7);
  this->otherHalf_ = 0;
  this->dir_ = '\x01';
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }